

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O2

int test_parserInternals(void)

{
  uint uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  xmlChar *pxVar18;
  char *pcVar19;
  xmlParserCtxtPtr pxVar20;
  long lVar21;
  int *piVar22;
  undefined1 uVar23;
  uint uVar24;
  undefined8 uVar25;
  ulong uVar26;
  ulong uVar27;
  int n_ctxt_1;
  uint uVar28;
  xmlChar *pxVar29;
  int *piVar30;
  int test_ret_5;
  uint uVar31;
  uint *puVar32;
  undefined8 *puVar33;
  uint uVar34;
  int *in_RSI;
  bool bVar35;
  int test_ret_8;
  int n_URL;
  uint uVar36;
  int local_84;
  int local_80;
  int test_ret_1;
  int local_78;
  int test_ret_6;
  int local_70;
  int local_6c;
  int test_ret_2;
  int local_64;
  int test_ret_3;
  int local_5c;
  int test_ret;
  int test_ret_4;
  int local_34;
  
  if (quiet == '\0') {
    puts("Testing parserInternals : 28 of 75 functions ...");
  }
  iVar14 = 0;
  for (uVar36 = 0; uVar36 != 5; uVar36 = uVar36 + 1) {
    iVar4 = xmlMemBlocks();
    gen_const_xmlChar_ptr(uVar36,(int)in_RSI);
    xmlCheckLanguageID();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar5 = xmlMemBlocks();
    if (iVar4 != iVar5) {
      iVar5 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCheckLanguageID",(ulong)(uint)(iVar5 - iVar4));
      iVar14 = iVar14 + 1;
      in_RSI = (int *)(ulong)uVar36;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_80 = 0;
  for (uVar36 = 0; uVar36 != 4; uVar36 = uVar36 + 1) {
    for (uVar8 = 0; uVar8 != 2; uVar8 = uVar8 + 1) {
      piVar22 = (int *)0x0;
      pxVar29 = (xmlChar *)0x0;
      if (uVar8 == 0) {
        pxVar29 = chartab;
      }
      while( true ) {
        iVar4 = (int)in_RSI;
        iVar5 = (int)piVar22;
        if (iVar5 == 4) break;
        iVar6 = xmlMemBlocks();
        iVar7 = gen_int(uVar36,iVar4);
        iVar4 = gen_int(iVar5,iVar4);
        in_RSI = (int *)pxVar29;
        xmlCopyChar(iVar7,pxVar29,iVar4);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar4 = xmlMemBlocks();
        if (iVar6 != iVar4) {
          iVar4 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlCopyChar",(ulong)(uint)(iVar4 - iVar6));
          local_80 = local_80 + 1;
          printf(" %d",(ulong)uVar36);
          printf(" %d",(ulong)uVar8);
          printf(" %d");
          putchar(10);
          in_RSI = piVar22;
        }
        piVar22 = (int *)(ulong)(iVar5 + 1);
      }
    }
  }
  function_tests = function_tests + 1;
  test_ret_1 = 0;
  for (uVar36 = 0; uVar36 != 2; uVar36 = uVar36 + 1) {
    piVar22 = (int *)0x0;
    while( true ) {
      iVar4 = (int)in_RSI;
      iVar5 = (int)piVar22;
      if (iVar5 == 4) break;
      iVar6 = xmlMemBlocks();
      uVar8 = gen_int(iVar5,iVar4);
      in_RSI = (int *)(ulong)uVar8;
      xmlCopyCharMultiByte();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      if (iVar6 != iVar4) {
        iVar4 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlCopyCharMultiByte",(ulong)(uint)(iVar4 - iVar6));
        test_ret_1 = test_ret_1 + 1;
        printf(" %d",(ulong)uVar36);
        printf(" %d");
        putchar(10);
        in_RSI = piVar22;
      }
      piVar22 = (int *)(ulong)(iVar5 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_84 = 0;
  for (uVar36 = 0; uVar36 != 5; uVar36 = uVar36 + 1) {
    uVar27 = 0;
    while (iVar4 = (int)uVar27, iVar4 != 5) {
      piVar22 = (int *)0x0;
      while( true ) {
        iVar5 = (int)in_RSI;
        iVar6 = (int)piVar22;
        if (iVar6 == 5) break;
        iVar7 = xmlMemBlocks();
        pxVar29 = gen_const_xmlChar_ptr(uVar36,iVar5);
        in_RSI = (int *)gen_const_xmlChar_ptr(iVar4,iVar5);
        pxVar18 = gen_const_xmlChar_ptr(iVar6,iVar5);
        xmlCreateEntityParserCtxt(pxVar29,in_RSI,pxVar18);
        xmlFreeParserCtxt();
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar5 = xmlMemBlocks();
        if (iVar7 != iVar5) {
          iVar5 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlCreateEntityParserCtxt",(ulong)(uint)(iVar5 - iVar7)
                );
          local_84 = local_84 + 1;
          printf(" %d",(ulong)uVar36);
          printf(" %d",uVar27);
          printf(" %d");
          putchar(10);
          in_RSI = piVar22;
        }
        piVar22 = (int *)(ulong)(iVar6 + 1);
      }
      uVar27 = (ulong)(iVar4 + 1);
    }
  }
  function_tests = function_tests + 1;
  test_ret_2 = 0;
  for (uVar36 = 0; uVar36 != 6; uVar36 = uVar36 + 1) {
    iVar4 = xmlMemBlocks();
    pcVar19 = gen_fileoutput(uVar36,(int)in_RSI);
    xmlCreateFileParserCtxt(pcVar19);
    xmlFreeParserCtxt();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar5 = xmlMemBlocks();
    if (iVar4 != iVar5) {
      iVar5 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCreateFileParserCtxt",(ulong)(uint)(iVar5 - iVar4));
      test_ret_2 = test_ret_2 + 1;
      in_RSI = (int *)(ulong)uVar36;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  iVar4 = 0;
  for (uVar36 = 0; uVar36 != 4; uVar36 = uVar36 + 1) {
    piVar22 = (int *)0x0;
    while( true ) {
      iVar5 = (int)in_RSI;
      iVar6 = (int)piVar22;
      if (iVar6 == 4) break;
      iVar7 = xmlMemBlocks();
      if (uVar36 == 0) {
        bVar35 = false;
        pcVar19 = "foo";
      }
      else if (uVar36 == 2) {
        bVar35 = false;
        pcVar19 = "test/ent2";
      }
      else if (uVar36 == 1) {
        bVar35 = false;
        pcVar19 = "<foo/>";
      }
      else {
        bVar35 = true;
        pcVar19 = (char *)0x0;
      }
      uVar8 = gen_int(iVar6,iVar5);
      if ((!bVar35) && (iVar5 = xmlStrlen(pcVar19), iVar5 < (int)uVar8)) {
        uVar8 = 0;
      }
      in_RSI = (int *)(ulong)uVar8;
      xmlCreateMemoryParserCtxt(pcVar19);
      xmlFreeParserCtxt();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar7 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlCreateMemoryParserCtxt",(ulong)(uint)(iVar5 - iVar7));
        iVar4 = iVar4 + 1;
        printf(" %d",(ulong)uVar36);
        printf(" %d");
        putchar(10);
        in_RSI = piVar22;
      }
      piVar22 = (int *)(ulong)(iVar6 + 1);
    }
  }
  function_tests = function_tests + 1;
  iVar5 = 0;
  for (uVar36 = 0; uVar36 != 6; uVar36 = uVar36 + 1) {
    piVar22 = (int *)0x0;
    while( true ) {
      iVar6 = (int)in_RSI;
      iVar7 = (int)piVar22;
      if (iVar7 == 4) break;
      iVar9 = xmlMemBlocks();
      pcVar19 = gen_fileoutput(uVar36,iVar6);
      uVar8 = gen_int(iVar7,iVar6);
      in_RSI = (int *)(ulong)uVar8;
      xmlCreateURLParserCtxt(pcVar19);
      xmlFreeParserCtxt();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      if (iVar9 != iVar6) {
        iVar6 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlCreateURLParserCtxt",(ulong)(uint)(iVar6 - iVar9));
        iVar5 = iVar5 + 1;
        printf(" %d",(ulong)uVar36);
        printf(" %d");
        putchar(10);
        in_RSI = piVar22;
      }
      piVar22 = (int *)(ulong)(iVar7 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_6c = 0;
  for (uVar36 = 0; uVar36 != 3; uVar36 = uVar36 + 1) {
    iVar6 = xmlMemBlocks();
    pxVar20 = gen_xmlParserCtxtPtr(uVar36,(int)in_RSI);
    xmlCtxtErrMemory();
    call_tests = call_tests + 1;
    if (pxVar20 != (xmlParserCtxtPtr)0x0) {
      xmlFreeParserCtxt();
    }
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 != iVar7) {
      iVar7 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCtxtErrMemory",(ulong)(uint)(iVar7 - iVar6));
      local_6c = local_6c + 1;
      in_RSI = (int *)(ulong)uVar36;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_70 = 0;
  for (uVar36 = 0; uVar36 != 3; uVar36 = uVar36 + 1) {
    iVar6 = xmlMemBlocks();
    pxVar20 = gen_xmlParserCtxtPtr(uVar36,(int)in_RSI);
    xmlCtxtPopInput(pxVar20);
    xmlFreeInputStream();
    call_tests = call_tests + 1;
    if (pxVar20 != (xmlParserCtxtPtr)0x0) {
      xmlFreeParserCtxt();
    }
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 != iVar7) {
      iVar7 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCtxtPopInput",(ulong)(uint)(iVar7 - iVar6));
      local_70 = local_70 + 1;
      in_RSI = (int *)(ulong)uVar36;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  test_ret_3 = 0;
  for (iVar6 = 0; iVar6 != 3; iVar6 = iVar6 + 1) {
    bVar35 = true;
    while (iVar7 = (int)in_RSI, bVar35) {
      iVar9 = xmlMemBlocks();
      pxVar20 = gen_xmlParserCtxtPtr(iVar6,iVar7);
      in_RSI = (int *)0x0;
      xmlCtxtPushInput();
      call_tests = call_tests + 1;
      if (pxVar20 != (xmlParserCtxtPtr)0x0) {
        xmlFreeParserCtxt();
      }
      xmlResetLastError();
      iVar7 = xmlMemBlocks();
      if (iVar9 == iVar7) break;
      iVar7 = xmlMemBlocks();
      bVar35 = false;
      printf("Leak of %d blocks found in xmlCtxtPushInput",(ulong)(uint)(iVar7 - iVar9));
      test_ret_3 = test_ret_3 + 1;
      printf(" %d");
      in_RSI = (int *)0x0;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_5c = 0;
  for (uVar36 = 0; uVar36 != 3; uVar36 = uVar36 + 1) {
    piVar22 = (int *)0x0;
    while( true ) {
      iVar6 = (int)in_RSI;
      iVar7 = (int)piVar22;
      if (iVar7 == 2) break;
      iVar9 = xmlMemBlocks();
      pxVar20 = gen_xmlParserCtxtPtr(uVar36,iVar6);
      in_RSI = (int *)0x0;
      if (iVar7 == 0) {
        in_RSI = inttab + 1;
      }
      xmlCurrentChar();
      call_tests = call_tests + 1;
      if (pxVar20 != (xmlParserCtxtPtr)0x0) {
        xmlFreeParserCtxt();
      }
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      if (iVar9 != iVar6) {
        iVar6 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlCurrentChar",(ulong)(uint)(iVar6 - iVar9));
        local_5c = local_5c + 1;
        printf(" %d",(ulong)uVar36);
        printf(" %d");
        putchar(10);
        in_RSI = piVar22;
      }
      piVar22 = (int *)(ulong)(iVar7 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_78 = 0;
  for (uVar36 = 0; uVar36 != 4; uVar36 = uVar36 + 1) {
    iVar6 = xmlMemBlocks();
    gen_int(uVar36,(int)in_RSI);
    xmlIsLetter();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 != iVar7) {
      iVar7 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlIsLetter",(ulong)(uint)(iVar7 - iVar6));
      local_78 = local_78 + 1;
      in_RSI = (int *)(ulong)uVar36;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  iVar6 = 0;
  for (iVar7 = 0; iVar7 != 3; iVar7 = iVar7 + 1) {
    bVar35 = true;
    while (iVar9 = (int)in_RSI, bVar35) {
      iVar10 = xmlMemBlocks();
      pxVar20 = gen_xmlParserCtxtPtr(iVar7,iVar9);
      in_RSI = (int *)0x0;
      xmlNewEntityInputStream(pxVar20);
      xmlFreeInputStream();
      call_tests = call_tests + 1;
      if (pxVar20 != (xmlParserCtxtPtr)0x0) {
        xmlFreeParserCtxt();
      }
      xmlResetLastError();
      iVar9 = xmlMemBlocks();
      if (iVar10 == iVar9) break;
      iVar9 = xmlMemBlocks();
      bVar35 = false;
      printf("Leak of %d blocks found in xmlNewEntityInputStream",(ulong)(uint)(iVar9 - iVar10));
      iVar6 = iVar6 + 1;
      printf(" %d");
      in_RSI = (int *)0x0;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  iVar7 = 0;
  for (uVar36 = 0; uVar36 != 3; uVar36 = uVar36 + 1) {
    piVar22 = (int *)0x0;
    while( true ) {
      iVar9 = (int)in_RSI;
      iVar10 = (int)piVar22;
      if (iVar10 == 8) break;
      iVar11 = xmlMemBlocks();
      pxVar20 = gen_xmlParserCtxtPtr(uVar36,iVar9);
      in_RSI = (int *)gen_filepath(iVar10,iVar9);
      xmlNewInputFromFile(pxVar20);
      xmlFreeInputStream();
      call_tests = call_tests + 1;
      if (pxVar20 != (xmlParserCtxtPtr)0x0) {
        xmlFreeParserCtxt();
      }
      xmlResetLastError();
      iVar9 = xmlMemBlocks();
      if (iVar11 != iVar9) {
        iVar9 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNewInputFromFile",(ulong)(uint)(iVar9 - iVar11));
        iVar7 = iVar7 + 1;
        printf(" %d",(ulong)uVar36);
        printf(" %d");
        putchar(10);
        in_RSI = piVar22;
      }
      piVar22 = (int *)(ulong)(iVar10 + 1);
    }
  }
  function_tests = function_tests + 1;
  test_ret_6 = 0;
  for (uVar36 = 0; uVar36 != 3; uVar36 = uVar36 + 1) {
    iVar9 = xmlMemBlocks();
    pxVar20 = gen_xmlParserCtxtPtr(uVar36,(int)in_RSI);
    xmlNewInputStream(pxVar20);
    xmlFreeInputStream();
    call_tests = call_tests + 1;
    if (pxVar20 != (xmlParserCtxtPtr)0x0) {
      xmlFreeParserCtxt();
    }
    xmlResetLastError();
    iVar10 = xmlMemBlocks();
    if (iVar9 != iVar10) {
      iVar10 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNewInputStream",(ulong)(uint)(iVar10 - iVar9));
      test_ret_6 = test_ret_6 + 1;
      in_RSI = (int *)(ulong)uVar36;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  iVar9 = 0;
  for (uVar36 = 0; uVar36 != 3; uVar36 = uVar36 + 1) {
    piVar22 = (int *)0x0;
    while( true ) {
      iVar10 = (int)in_RSI;
      iVar11 = (int)piVar22;
      if (iVar11 == 5) break;
      iVar12 = xmlMemBlocks();
      pxVar20 = gen_xmlParserCtxtPtr(uVar36,iVar10);
      in_RSI = (int *)gen_const_xmlChar_ptr(iVar11,iVar10);
      xmlNewStringInputStream(pxVar20);
      xmlFreeInputStream();
      call_tests = call_tests + 1;
      if (pxVar20 != (xmlParserCtxtPtr)0x0) {
        xmlFreeParserCtxt();
      }
      xmlResetLastError();
      iVar10 = xmlMemBlocks();
      if (iVar12 != iVar10) {
        iVar10 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNewStringInputStream",(ulong)(uint)(iVar10 - iVar12));
        iVar9 = iVar9 + 1;
        printf(" %d",(ulong)uVar36);
        printf(" %d");
        putchar(10);
        in_RSI = piVar22;
      }
      piVar22 = (int *)(ulong)(iVar11 + 1);
    }
  }
  function_tests = function_tests + 1;
  iVar10 = 0;
  piVar22 = (int *)0x0;
  while (iVar11 = (int)piVar22, iVar11 != 3) {
    iVar12 = xmlMemBlocks();
    pxVar20 = gen_xmlParserCtxtPtr(iVar11,(int)in_RSI);
    xmlNextChar();
    call_tests = call_tests + 1;
    if (pxVar20 != (xmlParserCtxtPtr)0x0) {
      xmlFreeParserCtxt();
    }
    xmlResetLastError();
    iVar13 = xmlMemBlocks();
    if (iVar12 != iVar13) {
      iVar13 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNextChar",(ulong)(uint)(iVar13 - iVar12));
      iVar10 = iVar10 + 1;
      printf(" %d");
      putchar(10);
      in_RSI = piVar22;
    }
    piVar22 = (int *)(ulong)(iVar11 + 1);
  }
  function_tests = function_tests + 1;
  local_78 = -(local_78 + iVar6 + iVar7 + test_ret_6 + iVar9 +
               local_6c + local_70 + test_ret_3 + local_5c +
               test_ret_2 + iVar4 + iVar5 + test_ret_1 + local_84 + iVar14 + local_80 + iVar10);
  bVar35 = true;
  while (bVar35) {
    iVar14 = xmlMemBlocks();
    xmlParserInputShrink(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar4 = xmlMemBlocks();
    if (iVar14 == iVar4) break;
    xmlMemBlocks();
    bVar35 = false;
    printf("Leak of %d blocks found in xmlParserInputShrink");
    in_RSI = (int *)0x0;
    printf(" %d");
    putchar(10);
    local_78 = local_78 + -1;
  }
  function_tests = function_tests + 1;
  local_34 = 0;
  for (uVar36 = 0; uVar36 != 3; uVar36 = uVar36 + 1) {
    iVar14 = xmlMemBlocks();
    pxVar20 = gen_xmlParserCtxtPtr(uVar36,(int)in_RSI);
    xmlPopInput(pxVar20);
    call_tests = call_tests + 1;
    if (pxVar20 != (xmlParserCtxtPtr)0x0) {
      xmlFreeParserCtxt(pxVar20);
    }
    xmlResetLastError();
    iVar4 = xmlMemBlocks();
    if (iVar14 != iVar4) {
      iVar4 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlPopInput",(ulong)(uint)(iVar4 - iVar14));
      local_34 = local_34 + 1;
      in_RSI = (int *)(ulong)uVar36;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  iVar14 = 0;
  local_64 = 0;
  do {
    if (iVar14 == 3) {
      function_tests = function_tests + 1;
      test_ret_6 = 0;
      uVar27 = 0;
      while (iVar14 = (int)uVar27, iVar14 != 3) {
        for (iVar4 = 0; iVar4 != 5; iVar4 = iVar4 + 1) {
          bVar35 = true;
          while (iVar5 = (int)in_RSI, bVar35) {
            iVar6 = xmlMemBlocks();
            pxVar20 = gen_xmlParserCtxtPtr(iVar14,iVar5);
            in_RSI = (int *)gen_const_xmlChar_ptr(iVar4,iVar5);
            lVar21 = xmlSplitQName(pxVar20,in_RSI,0);
            if (lVar21 != 0) {
              (*_xmlFree)(lVar21);
            }
            call_tests = call_tests + 1;
            if (pxVar20 != (xmlParserCtxtPtr)0x0) {
              xmlFreeParserCtxt(pxVar20);
            }
            xmlResetLastError();
            iVar5 = xmlMemBlocks();
            if (iVar6 == iVar5) break;
            iVar5 = xmlMemBlocks();
            bVar35 = false;
            printf("Leak of %d blocks found in xmlSplitQName",(ulong)(uint)(iVar5 - iVar6));
            test_ret_6 = test_ret_6 + 1;
            printf(" %d",uVar27);
            printf(" %d");
            in_RSI = (int *)0x0;
            printf(" %d");
            putchar(10);
          }
        }
        uVar27 = (ulong)(iVar14 + 1);
      }
      function_tests = function_tests + 1;
      local_70 = 0;
      for (uVar36 = 0; uVar36 != 3; uVar36 = uVar36 + 1) {
        uVar27 = 0;
        while (iVar14 = (int)uVar27, iVar14 != 5) {
          piVar22 = (int *)0x0;
          while( true ) {
            iVar4 = (int)in_RSI;
            iVar5 = (int)piVar22;
            if (iVar5 == 2) break;
            iVar6 = xmlMemBlocks();
            pxVar20 = gen_xmlParserCtxtPtr(uVar36,iVar4);
            in_RSI = (int *)gen_const_xmlChar_ptr(iVar14,iVar4);
            uVar25 = 0;
            if (iVar5 == 0) {
              uVar25 = 0x15c408;
            }
            xmlStringCurrentChar(pxVar20,in_RSI,uVar25);
            call_tests = call_tests + 1;
            if (pxVar20 != (xmlParserCtxtPtr)0x0) {
              xmlFreeParserCtxt(pxVar20);
            }
            xmlResetLastError();
            iVar4 = xmlMemBlocks();
            if (iVar6 != iVar4) {
              iVar4 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlStringCurrentChar",(ulong)(uint)(iVar4 - iVar6))
              ;
              local_70 = local_70 + 1;
              printf(" %d",(ulong)uVar36);
              printf(" %d",uVar27);
              printf(" %d");
              putchar(10);
              in_RSI = piVar22;
            }
            piVar22 = (int *)(ulong)(iVar5 + 1);
          }
          uVar27 = (ulong)(iVar14 + 1);
        }
      }
      function_tests = function_tests + 1;
      local_6c = 0;
      for (uVar36 = 0; uVar36 != 3; uVar36 = uVar36 + 1) {
        uVar27 = 0;
        while (iVar14 = (int)uVar27, iVar14 != 5) {
          for (uVar8 = 0; uVar8 != 4; uVar8 = uVar8 + 1) {
            uVar26 = 0;
            while (uVar28 = (uint)uVar26, uVar28 != 4) {
              uVar2 = (undefined1)(0xf82061 >> ((char)uVar26 * '\b' & 0x1fU));
              in_RSI = (int *)0x0;
              if (2 < uVar28) {
                uVar2 = 0;
              }
              while (uVar17 = (uint)in_RSI, uVar17 != 4) {
                uVar3 = (undefined1)(0xf82061 >> ((char)in_RSI * '\b' & 0x1fU));
                piVar30 = (int *)0x0;
                piVar22 = in_RSI;
                if (2 < uVar17) {
                  uVar3 = 0;
                }
                while( true ) {
                  iVar4 = (int)piVar22;
                  uVar24 = (uint)piVar30;
                  if (uVar24 == 4) break;
                  iVar5 = xmlMemBlocks();
                  pxVar20 = gen_xmlParserCtxtPtr(uVar36,iVar4);
                  piVar22 = (int *)gen_const_xmlChar_ptr(iVar14,iVar4);
                  iVar4 = gen_int(uVar8,iVar4);
                  uVar23 = (undefined1)(0xf82061 >> ((char)piVar30 * '\b' & 0x1fU));
                  if (2 < uVar24) {
                    uVar23 = 0;
                  }
                  lVar21 = xmlStringDecodeEntities(pxVar20,piVar22,iVar4,uVar2,uVar3,uVar23);
                  if (lVar21 != 0) {
                    (*_xmlFree)(lVar21);
                  }
                  call_tests = call_tests + 1;
                  if (pxVar20 != (xmlParserCtxtPtr)0x0) {
                    xmlFreeParserCtxt(pxVar20);
                  }
                  xmlResetLastError();
                  iVar4 = xmlMemBlocks();
                  if (iVar5 != iVar4) {
                    iVar4 = xmlMemBlocks();
                    printf("Leak of %d blocks found in xmlStringDecodeEntities",
                           (ulong)(uint)(iVar4 - iVar5));
                    local_6c = local_6c + 1;
                    printf(" %d",(ulong)uVar36);
                    printf(" %d",uVar27);
                    printf(" %d",(ulong)uVar8);
                    printf(" %d",uVar26);
                    printf(" %d",in_RSI);
                    printf(" %d");
                    putchar(10);
                    piVar22 = piVar30;
                  }
                  piVar30 = (int *)(ulong)(uVar24 + 1);
                }
                in_RSI = (int *)(ulong)(uVar17 + 1);
              }
              uVar26 = (ulong)(uVar28 + 1);
            }
          }
          uVar27 = (ulong)(iVar14 + 1);
        }
      }
      function_tests = function_tests + 1;
      test_ret_2 = 0;
      for (uVar36 = 0; uVar36 != 3; uVar36 = uVar36 + 1) {
        for (uVar8 = 0; uVar8 != 5; uVar8 = uVar8 + 1) {
          for (uVar28 = 0; uVar28 != 4; uVar28 = uVar28 + 1) {
            for (uVar17 = 0; uVar17 != 4; uVar17 = uVar17 + 1) {
              uVar27 = 0;
              while (uVar24 = (uint)uVar27, uVar24 != 4) {
                uVar15 = 0xf82061 >> ((char)uVar27 * '\b' & 0x1fU);
                in_RSI = (int *)0x0;
                if (2 < uVar24) {
                  uVar15 = 0;
                }
                while (uVar34 = (uint)in_RSI, uVar34 != 4) {
                  uVar16 = 0xf82061 >> ((char)in_RSI * '\b' & 0x1fU);
                  piVar30 = (int *)0x0;
                  piVar22 = in_RSI;
                  if (2 < uVar34) {
                    uVar16 = 0;
                  }
                  while( true ) {
                    iVar14 = (int)piVar22;
                    uVar31 = (uint)piVar30;
                    if (uVar31 == 4) break;
                    iVar4 = xmlMemBlocks();
                    pxVar20 = gen_xmlParserCtxtPtr(uVar36,iVar14);
                    piVar22 = (int *)gen_const_xmlChar_ptr(uVar8,iVar14);
                    iVar5 = gen_int(uVar28,iVar14);
                    iVar14 = gen_int(uVar17,iVar14);
                    uVar1 = 0xf82061 >> ((char)piVar30 * '\b' & 0x1fU);
                    if (2 < uVar31) {
                      uVar1 = 0;
                    }
                    if ((piVar22 != (int *)0x0) && (iVar6 = xmlStrlen(piVar22), iVar6 < iVar5)) {
                      iVar5 = 0;
                    }
                    lVar21 = xmlStringLenDecodeEntities
                                       (pxVar20,piVar22,iVar5,iVar14,uVar15 & 0xff,uVar16 & 0xff,
                                        uVar1 & 0xff);
                    if (lVar21 != 0) {
                      (*_xmlFree)(lVar21);
                    }
                    call_tests = call_tests + 1;
                    if (pxVar20 != (xmlParserCtxtPtr)0x0) {
                      xmlFreeParserCtxt(pxVar20);
                    }
                    xmlResetLastError();
                    iVar14 = xmlMemBlocks();
                    if (iVar4 != iVar14) {
                      iVar14 = xmlMemBlocks();
                      printf("Leak of %d blocks found in xmlStringLenDecodeEntities",
                             (ulong)(uint)(iVar14 - iVar4));
                      test_ret_2 = test_ret_2 + 1;
                      printf(" %d",(ulong)uVar36);
                      printf(" %d",(ulong)uVar8);
                      printf(" %d",(ulong)uVar28);
                      printf(" %d",(ulong)uVar17);
                      printf(" %d",uVar27);
                      printf(" %d",in_RSI);
                      printf(" %d");
                      putchar(10);
                      piVar22 = piVar30;
                    }
                    piVar30 = (int *)(ulong)(uVar31 + 1);
                  }
                  in_RSI = (int *)(ulong)(uVar34 + 1);
                }
                uVar27 = (ulong)(uVar24 + 1);
              }
            }
          }
        }
      }
      function_tests = function_tests + 1;
      local_84 = 0;
      for (uVar36 = 0; uVar36 != 3; uVar36 = uVar36 + 1) {
        piVar22 = (int *)0x0;
        puVar32 = &DAT_001490bc;
        while( true ) {
          iVar14 = (int)in_RSI;
          uVar8 = (uint)piVar22;
          if (uVar8 == 4) break;
          iVar4 = xmlMemBlocks();
          pxVar20 = gen_xmlParserCtxtPtr(uVar36,iVar14);
          in_RSI = (int *)0xffffffffffffffff;
          if (uVar8 < 3) {
            in_RSI = (int *)(ulong)*puVar32;
          }
          xmlSwitchEncoding(pxVar20);
          call_tests = call_tests + 1;
          if (pxVar20 != (xmlParserCtxtPtr)0x0) {
            xmlFreeParserCtxt(pxVar20);
          }
          xmlResetLastError();
          iVar14 = xmlMemBlocks();
          if (iVar4 != iVar14) {
            iVar14 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlSwitchEncoding",(ulong)(uint)(iVar14 - iVar4));
            local_84 = local_84 + 1;
            printf(" %d",(ulong)uVar36);
            printf(" %d");
            putchar(10);
            in_RSI = piVar22;
          }
          piVar22 = (int *)(ulong)(uVar8 + 1);
          puVar32 = puVar32 + 1;
        }
      }
      function_tests = function_tests + 1;
      local_80 = 0;
      for (uVar36 = 0; uVar36 != 3; uVar36 = uVar36 + 1) {
        piVar22 = (int *)0x0;
        puVar33 = &DAT_00159d68;
        while( true ) {
          iVar14 = (int)in_RSI;
          uVar8 = (uint)piVar22;
          if (uVar8 == 4) break;
          iVar4 = xmlMemBlocks();
          pxVar20 = gen_xmlParserCtxtPtr(uVar36,iVar14);
          if (uVar8 < 3) {
            in_RSI = (int *)*puVar33;
          }
          else {
            in_RSI = (int *)0x0;
          }
          xmlSwitchEncodingName(pxVar20);
          call_tests = call_tests + 1;
          if (pxVar20 != (xmlParserCtxtPtr)0x0) {
            xmlFreeParserCtxt(pxVar20);
          }
          xmlResetLastError();
          iVar14 = xmlMemBlocks();
          if (iVar4 != iVar14) {
            iVar14 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlSwitchEncodingName",(ulong)(uint)(iVar14 - iVar4))
            ;
            local_80 = local_80 + 1;
            printf(" %d",(ulong)uVar36);
            printf(" %d");
            putchar(10);
            in_RSI = piVar22;
          }
          piVar22 = (int *)(ulong)(uVar8 + 1);
          puVar33 = puVar33 + 1;
        }
      }
      function_tests = function_tests + 1;
      iVar4 = 0;
      for (iVar14 = 0; iVar14 != 3; iVar14 = iVar14 + 1) {
        bVar35 = true;
        while (bVar35) {
          bVar35 = true;
          while (iVar5 = (int)in_RSI, bVar35) {
            iVar6 = xmlMemBlocks();
            pxVar20 = gen_xmlParserCtxtPtr(iVar14,iVar5);
            in_RSI = (int *)0x0;
            xmlSwitchInputEncoding(pxVar20,0,0);
            call_tests = call_tests + 1;
            if (pxVar20 != (xmlParserCtxtPtr)0x0) {
              xmlFreeParserCtxt(pxVar20);
            }
            xmlResetLastError();
            iVar5 = xmlMemBlocks();
            if (iVar6 == iVar5) break;
            iVar5 = xmlMemBlocks();
            bVar35 = false;
            printf("Leak of %d blocks found in xmlSwitchInputEncoding",(ulong)(uint)(iVar5 - iVar6))
            ;
            iVar4 = iVar4 + 1;
            printf(" %d");
            printf(" %d");
            in_RSI = (int *)0x0;
            printf(" %d");
            putchar(10);
          }
          bVar35 = false;
        }
      }
      function_tests = function_tests + 1;
      iVar14 = 0;
      iVar5 = 0;
      do {
        if (iVar14 == 3) {
          function_tests = function_tests + 1;
          iVar14 = local_80 + iVar4 + iVar5 +
                   local_6c + test_ret_2 + local_84 + test_ret_6 + local_70 + local_34 + local_64;
          uVar36 = -(local_78 - iVar14);
          if (local_78 != iVar14) {
            printf("Module parserInternals: %d errors\n",(ulong)uVar36);
          }
          return uVar36;
        }
        bVar35 = true;
        while (iVar6 = (int)in_RSI, bVar35) {
          iVar7 = xmlMemBlocks();
          pxVar20 = gen_xmlParserCtxtPtr(iVar14,iVar6);
          in_RSI = (int *)0x0;
          xmlSwitchToEncoding(pxVar20);
          call_tests = call_tests + 1;
          if (pxVar20 != (xmlParserCtxtPtr)0x0) {
            xmlFreeParserCtxt(pxVar20);
          }
          xmlResetLastError();
          iVar6 = xmlMemBlocks();
          if (iVar7 == iVar6) break;
          iVar6 = xmlMemBlocks();
          bVar35 = false;
          printf("Leak of %d blocks found in xmlSwitchToEncoding",(ulong)(uint)(iVar6 - iVar7));
          iVar5 = iVar5 + 1;
          printf(" %d");
          in_RSI = (int *)0x0;
          printf(" %d");
          putchar(10);
        }
        iVar14 = iVar14 + 1;
      } while( true );
    }
    bVar35 = true;
    while (iVar4 = (int)in_RSI, bVar35) {
      iVar5 = xmlMemBlocks();
      pxVar20 = gen_xmlParserCtxtPtr(iVar14,iVar4);
      in_RSI = (int *)0x0;
      xmlPushInput(pxVar20);
      call_tests = call_tests + 1;
      if (pxVar20 != (xmlParserCtxtPtr)0x0) {
        xmlFreeParserCtxt(pxVar20);
      }
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      if (iVar5 == iVar4) break;
      iVar4 = xmlMemBlocks();
      bVar35 = false;
      printf("Leak of %d blocks found in xmlPushInput",(ulong)(uint)(iVar4 - iVar5));
      local_64 = local_64 + 1;
      printf(" %d");
      in_RSI = (int *)0x0;
      printf(" %d");
      putchar(10);
    }
    iVar14 = iVar14 + 1;
  } while( true );
}

Assistant:

static int
test_parserInternals(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing parserInternals : 28 of 75 functions ...\n");
    test_ret += test_xmlCheckLanguageID();
    test_ret += test_xmlCopyChar();
    test_ret += test_xmlCopyCharMultiByte();
    test_ret += test_xmlCreateEntityParserCtxt();
    test_ret += test_xmlCreateFileParserCtxt();
    test_ret += test_xmlCreateMemoryParserCtxt();
    test_ret += test_xmlCreateURLParserCtxt();
    test_ret += test_xmlCtxtErrMemory();
    test_ret += test_xmlCtxtPopInput();
    test_ret += test_xmlCtxtPushInput();
    test_ret += test_xmlCurrentChar();
    test_ret += test_xmlIsLetter();
    test_ret += test_xmlNewEntityInputStream();
    test_ret += test_xmlNewInputFromFile();
    test_ret += test_xmlNewInputStream();
    test_ret += test_xmlNewStringInputStream();
    test_ret += test_xmlNextChar();
    test_ret += test_xmlParserInputShrink();
    test_ret += test_xmlPopInput();
    test_ret += test_xmlPushInput();
    test_ret += test_xmlSplitQName();
    test_ret += test_xmlStringCurrentChar();
    test_ret += test_xmlStringDecodeEntities();
    test_ret += test_xmlStringLenDecodeEntities();
    test_ret += test_xmlSwitchEncoding();
    test_ret += test_xmlSwitchEncodingName();
    test_ret += test_xmlSwitchInputEncoding();
    test_ret += test_xmlSwitchToEncoding();

    if (test_ret != 0)
	printf("Module parserInternals: %d errors\n", test_ret);
    return(test_ret);
}